

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::Postprocess_CollectMetadata
          (X3DImporter *this,CX3DImporter_NodeElement *pNodeElement,aiNode *pSceneNode)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long *plVar4;
  aiMetadata *paVar5;
  aiString *paVar6;
  aiMetadataEntry *__s;
  undefined4 *puVar7;
  undefined8 *puVar8;
  float *pfVar9;
  runtime_error *prVar10;
  uint uVar11;
  aiString *paVar12;
  ulong uVar13;
  size_t __n;
  long lVar14;
  _Node_conflict *__tmp;
  _List_node_base *p_Var15;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> meta_list;
  aiString tstr;
  allocator<char> local_479;
  aiString *local_478;
  _List_node_base local_470;
  ulong local_460;
  long *local_458;
  ulong local_450;
  long local_448 [2];
  undefined8 local_438;
  undefined1 local_428 [1016];
  
  local_460 = 0;
  local_470._M_next = &local_470;
  local_470._M_prev = &local_470;
  PostprocessHelper_CollectMetadata
            (this,pNodeElement,
             (list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *)
             &local_470);
  uVar13 = local_460;
  p_Var15 = local_470._M_next;
  if (local_470._M_next != &local_470) {
    if (pSceneNode->mMetaData != (aiMetadata *)0x0) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_438 = local_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_438,
                 "Postprocess. MetaData member in node are not nullptr. Something went wrong.","");
      std::runtime_error::runtime_error(prVar10,(string *)&local_438);
      *(undefined ***)prVar10 = &PTR__runtime_error_008bf448;
      __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar11 = (uint)local_460;
    if (uVar11 == 0) {
      paVar5 = (aiMetadata *)0x0;
    }
    else {
      paVar5 = (aiMetadata *)operator_new(0x18);
      uVar13 = uVar13 & 0xffffffff;
      paVar5->mNumProperties = uVar11;
      paVar6 = (aiString *)operator_new__(uVar13 * 0x404);
      paVar12 = paVar6;
      do {
        paVar12->length = 0;
        paVar12->data[0] = '\0';
        memset(paVar12->data + 1,0x1b,0x3ff);
        paVar12 = paVar12 + 1;
      } while (paVar12 != paVar6 + uVar13);
      paVar5->mKeys = paVar6;
      __s = (aiMetadataEntry *)operator_new__(uVar13 << 4);
      memset(__s,0,uVar13 << 4);
      paVar5->mValues = __s;
    }
    pSceneNode->mMetaData = paVar5;
    uVar11 = 0;
    do {
      p_Var1 = p_Var15[1]._M_next;
      switch(*(undefined4 *)&p_Var1->_M_prev) {
      case 1:
        p_Var2 = p_Var1[9]._M_next;
        if (((((long)p_Var1[10]._M_next - (long)p_Var2) * 8 + (ulong)*(uint *)&p_Var1[10]._M_prev !=
              0) && (paVar5 = pSceneNode->mMetaData, uVar11 < paVar5->mNumProperties)) &&
           (p_Var3 = p_Var1[5]._M_prev, p_Var3 != (_List_node_base *)0x0)) {
          uVar13 = (ulong)uVar11;
          if (p_Var3 < (_List_node_base *)0x400) {
            paVar6 = paVar5->mKeys;
            paVar12 = paVar6 + uVar13;
            paVar12->length = (ai_uint32)p_Var3;
            memcpy(paVar12->data,p_Var1[5]._M_next,(size_t)p_Var3);
            paVar6[uVar13].data[(long)p_Var3] = '\0';
          }
          lVar14 = uVar13 * 0x10;
          paVar5->mValues[uVar13].mType = AI_BOOL;
          puVar8 = (undefined8 *)operator_new(0x10);
          *puVar8 = p_Var2;
          puVar8[1] = 1;
LAB_005f4b75:
          *(undefined8 **)((long)&paVar5->mValues->mData + lVar14) = puVar8;
        }
        break;
      case 2:
        if (((p_Var1[9]._M_prev != p_Var1[9]._M_next) &&
            (paVar5 = pSceneNode->mMetaData, uVar11 < paVar5->mNumProperties)) &&
           (p_Var2 = p_Var1[5]._M_prev, p_Var2 != (_List_node_base *)0x0)) {
          p_Var3 = (p_Var1[9]._M_next)->_M_next;
          if (p_Var2 < (_List_node_base *)0x400) {
            local_478 = paVar5->mKeys + uVar11;
            paVar12 = paVar5->mKeys + uVar11;
            paVar12->length = (ai_uint32)p_Var2;
            memcpy(paVar12->data,p_Var1[5]._M_next,(size_t)p_Var2);
            local_478->data[(long)p_Var2] = '\0';
          }
          paVar5->mValues[uVar11].mType = AI_FLOAT;
          pfVar9 = (float *)operator_new(4);
          *pfVar9 = (float)(double)p_Var3;
          paVar5->mValues[uVar11].mData = pfVar9;
        }
        break;
      case 3:
        p_Var2 = p_Var1[9]._M_next;
        if (((p_Var1[9]._M_prev != p_Var2) &&
            (paVar5 = pSceneNode->mMetaData, uVar11 < paVar5->mNumProperties)) &&
           (p_Var3 = p_Var1[5]._M_prev, p_Var3 != (_List_node_base *)0x0)) {
          uVar13 = (ulong)uVar11;
          if (p_Var3 < (_List_node_base *)0x400) {
            paVar6 = paVar5->mKeys;
            paVar12 = paVar6 + uVar13;
            paVar12->length = (ai_uint32)p_Var3;
            memcpy(paVar12->data,p_Var1[5]._M_next,(size_t)p_Var3);
            paVar6[uVar13].data[(long)p_Var3] = '\0';
          }
          lVar14 = uVar13 * 0x10;
          paVar5->mValues[uVar13].mType = AI_FLOAT;
          puVar8 = (undefined8 *)operator_new(4);
          *(undefined4 *)puVar8 = *(undefined4 *)&p_Var2->_M_next;
          goto LAB_005f4b75;
        }
        break;
      case 4:
        p_Var2 = p_Var1[9]._M_next;
        if (((p_Var1[9]._M_prev != p_Var2) &&
            (paVar5 = pSceneNode->mMetaData, uVar11 < paVar5->mNumProperties)) &&
           (p_Var3 = p_Var1[5]._M_prev, p_Var3 != (_List_node_base *)0x0)) {
          uVar13 = (ulong)uVar11;
          if (p_Var3 < (_List_node_base *)0x400) {
            paVar6 = paVar5->mKeys;
            paVar12 = paVar6 + uVar13;
            paVar12->length = (ai_uint32)p_Var3;
            memcpy(paVar12->data,p_Var1[5]._M_next,(size_t)p_Var3);
            paVar6[uVar13].data[(long)p_Var3] = '\0';
          }
          lVar14 = uVar13 * 0x10;
          paVar5->mValues[uVar13].mType = AI_INT32;
          puVar8 = (undefined8 *)operator_new(4);
          *(undefined4 *)puVar8 = *(undefined4 *)&p_Var2->_M_next;
          goto LAB_005f4b75;
        }
        break;
      default:
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_438 = local_428;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_438,"Postprocess. Unknown metadata type.","");
        std::runtime_error::runtime_error(prVar10,(string *)&local_438);
        *(undefined ***)prVar10 = &PTR__runtime_error_008bf448;
        __cxa_throw(prVar10,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      case 6:
        if (p_Var1[10]._M_next != (_List_node_base *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_458,(char *)p_Var1[9]._M_next[1]._M_next,&local_479);
          plVar4 = local_458;
          __n = local_450 & 0xffffffff;
          if ((local_450 & 0xfffffc00) != 0) {
            __n = 0x3ff;
          }
          local_438 = (undefined1 *)CONCAT44(local_438._4_4_,(uint)__n);
          memcpy((void *)((long)&local_438 + 4),local_458,__n);
          *(undefined1 *)((long)&local_438 + __n + 4) = 0;
          if (plVar4 != local_448) {
            operator_delete(plVar4,local_448[0] + 1);
          }
          paVar5 = pSceneNode->mMetaData;
          if ((uVar11 < paVar5->mNumProperties) &&
             (p_Var2 = p_Var1[5]._M_prev, p_Var2 != (_List_node_base *)0x0)) {
            if (p_Var2 < (_List_node_base *)0x400) {
              local_478 = paVar5->mKeys + uVar11;
              paVar12 = paVar5->mKeys + uVar11;
              paVar12->length = (ai_uint32)p_Var2;
              memcpy(paVar12->data,p_Var1[5]._M_next,(size_t)p_Var2);
              local_478->data[(long)p_Var2] = '\0';
            }
            paVar5->mValues[uVar11].mType = AI_AISTRING;
            puVar7 = (undefined4 *)operator_new(0x404);
            if (0x3fe < (uint)__n) {
              __n = 0x3ff;
            }
            *puVar7 = (int)__n;
            memcpy(puVar7 + 1,(void *)((long)&local_438 + 4),__n);
            *(undefined1 *)((long)puVar7 + __n + 4) = 0;
            paVar5->mValues[uVar11].mData = puVar7;
          }
        }
      }
      p_Var15 = p_Var15->_M_next;
      uVar11 = uVar11 + 1;
    } while (p_Var15 != &local_470);
  }
  p_Var15 = local_470._M_next;
  while (p_Var15 != &local_470) {
    p_Var1 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var15,0x18);
    p_Var15 = p_Var1;
  }
  return;
}

Assistant:

void X3DImporter::Postprocess_CollectMetadata(const CX3DImporter_NodeElement& pNodeElement, aiNode& pSceneNode) const
{
    std::list<CX3DImporter_NodeElement*> meta_list;
    size_t meta_idx;

	PostprocessHelper_CollectMetadata(pNodeElement, meta_list);// find metadata in current node element.
	if ( !meta_list.empty() )
	{
        if ( pSceneNode.mMetaData != nullptr ) {
            throw DeadlyImportError( "Postprocess. MetaData member in node are not nullptr. Something went wrong." );
        }

		// copy collected metadata to output node.
        pSceneNode.mMetaData = aiMetadata::Alloc( static_cast<unsigned int>(meta_list.size()) );
		meta_idx = 0;
		for(std::list<CX3DImporter_NodeElement*>::const_iterator it = meta_list.begin(); it != meta_list.end(); ++it, ++meta_idx)
		{
			CX3DImporter_NodeElement_Meta* cur_meta = (CX3DImporter_NodeElement_Meta*)*it;

			// due to limitations we can add only first element of value list.
			// Add an element according to its type.
			if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaBoolean)
			{
				if(((CX3DImporter_NodeElement_MetaBoolean*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaBoolean*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaDouble)
			{
				if(((CX3DImporter_NodeElement_MetaDouble*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, (float)*(((CX3DImporter_NodeElement_MetaDouble*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaFloat)
			{
				if(((CX3DImporter_NodeElement_MetaFloat*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaFloat*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaInteger)
			{
				if(((CX3DImporter_NodeElement_MetaInteger*)cur_meta)->Value.size() > 0)
					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, *(((CX3DImporter_NodeElement_MetaInteger*)cur_meta)->Value.begin()));
			}
			else if((*it)->Type == CX3DImporter_NodeElement::ENET_MetaString)
			{
				if(((CX3DImporter_NodeElement_MetaString*)cur_meta)->Value.size() > 0)
				{
					aiString tstr(((CX3DImporter_NodeElement_MetaString*)cur_meta)->Value.begin()->data());

					pSceneNode.mMetaData->Set(static_cast<unsigned int>(meta_idx), cur_meta->Name, tstr);
				}
			}
			else
			{
				throw DeadlyImportError("Postprocess. Unknown metadata type.");
			}// if((*it)->Type == CX3DImporter_NodeElement::ENET_Meta*) else
		}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = meta_list.begin(); it != meta_list.end(); it++)
	}// if( !meta_list.empty() )
}